

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

String __thiscall testing::internal::CapturedStream::ReadEntireFile(CapturedStream *this,FILE *file)

{
  size_t sVar1;
  char *buffer;
  size_t sVar2;
  size_t extraout_RDX;
  ulong a_length;
  String SVar3;
  
  sVar1 = GetFileSize(file);
  buffer = (char *)operator_new__(sVar1);
  a_length = 0;
  fseek((FILE *)file,0,0);
  do {
    sVar2 = fread(buffer + a_length,1,sVar1 - a_length,(FILE *)file);
    a_length = a_length + sVar2;
    if (sVar2 == 0) break;
  } while (a_length < sVar1);
  String::ConstructNonNull((String *)this,buffer,a_length);
  operator_delete__(buffer);
  SVar3.length_ = extraout_RDX;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

String CapturedStream::ReadEntireFile(FILE* file) {
  const size_t file_size = GetFileSize(file);
  char* const buffer = new char[file_size];

  size_t bytes_last_read = 0;  // # of bytes read in the last fread()
  size_t bytes_read = 0;       // # of bytes read so far

  fseek(file, 0, SEEK_SET);

  // Keeps reading the file until we cannot read further or the
  // pre-determined file size is reached.
  do {
    bytes_last_read = fread(buffer+bytes_read, 1, file_size-bytes_read, file);
    bytes_read += bytes_last_read;
  } while (bytes_last_read > 0 && bytes_read < file_size);

  const String content(buffer, bytes_read);
  delete[] buffer;

  return content;
}